

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

ImFont * __thiscall
ImFontAtlas::AddFontFromMemoryCompressedTTF
          (ImFontAtlas *this,void *compressed_ttf_data,int compressed_ttf_size,float size_pixels,
          ImFontConfig *font_cfg_template,ImWchar *glyph_ranges)

{
  uchar *puVar1;
  float fVar2;
  float fVar3;
  byte bVar4;
  byte bVar5;
  uchar *puVar6;
  long lVar7;
  ImFont *pIVar8;
  byte bVar9;
  ushort uVar10;
  uint uVar11;
  int iVar12;
  ulong uVar13;
  uchar *puVar14;
  ulong uVar15;
  uchar *__dest;
  uchar *puVar16;
  uchar *puVar17;
  byte *pbVar18;
  byte *pbVar19;
  uint uVar20;
  undefined7 local_170;
  uint uStack_169;
  undefined8 local_148;
  undefined8 uStack_140;
  undefined8 local_138;
  ImWchar *pIStack_130;
  float local_128;
  char local_118 [46];
  undefined2 uStack_ea;
  undefined6 uStack_e8;
  ImFontConfig local_d8;
  float local_48;
  
  uVar11 = *(uint *)((long)compressed_ttf_data + 8);
  uVar20 = uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18;
  local_48 = size_pixels;
  puVar6 = (uchar *)ImGui::MemAlloc((ulong)uVar20);
  uVar11 = *compressed_ttf_data;
  if (((uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 | uVar11 << 0x18) ==
       0x57bc0000) &&
     (uVar11 = *(uint *)((long)compressed_ttf_data + 4),
     ((uVar11 >> 0x18 == 0 && (uVar11 & 0xff0000) == 0) && (uVar11 & 0xff00) == 0) &&
     (uVar11 & 0xff) == 0)) {
    uVar11 = *(uint *)((long)compressed_ttf_data + 8);
    uVar15 = (ulong)(uVar11 >> 0x18 | (uVar11 & 0xff0000) >> 8 | (uVar11 & 0xff00) << 8 |
                    uVar11 << 0x18);
    puVar1 = puVar6 + uVar15;
    puVar16 = puVar6 + uVar15 + 1;
    __dest = puVar6;
    pbVar18 = (byte *)((long)compressed_ttf_data + 0x10);
    stb__barrier_in_b = (uchar *)compressed_ttf_data;
    stb__barrier_out_e = puVar1;
    stb__barrier_out_b = puVar6;
    stb__dout = puVar6;
    do {
      bVar5 = *pbVar18;
      uVar11 = (uint)bVar5;
      if (bVar5 < 0x20) {
        if (bVar5 < 0x18) {
          if (bVar5 < 0x10) {
            if (bVar5 < 8) {
              if (bVar5 == 4) {
                uVar10 = *(ushort *)(pbVar18 + 4) << 8 | *(ushort *)(pbVar18 + 4) >> 8;
                puVar14 = __dest + (ulong)uVar10 + 1;
                if (__dest + (ulong)uVar10 + 1 <= puVar1) {
                  bVar5 = pbVar18[1];
                  bVar9 = pbVar18[2];
                  bVar4 = pbVar18[3];
                  puVar14 = puVar16;
                  if (puVar6 <= __dest + ~((ulong)bVar5 * 0x10000 + (ulong)bVar4 |
                                          (ulong)bVar9 * 0x100)) {
                    iVar12 = uVar10 + 1;
                    do {
                      puVar14 = __dest + 1;
                      *__dest = __dest[~((ulong)bVar4 + (ulong)bVar9 * 0x100) +
                                       (ulong)bVar5 * -0x10000];
                      iVar12 = iVar12 + -1;
                      __dest = puVar14;
                    } while (iVar12 != 0);
                  }
                }
                pbVar19 = pbVar18 + 6;
                stb__dout = puVar14;
              }
              else {
                if (uVar11 != 6) {
                  if (uVar11 == 7) {
                    uVar15 = (ulong)(ushort)(*(ushort *)(pbVar18 + 1) << 8 |
                                            *(ushort *)(pbVar18 + 1) >> 8);
                    puVar17 = __dest + uVar15 + 1;
                    puVar14 = puVar17;
                    if ((puVar17 <= puVar1) &&
                       (puVar14 = puVar16, compressed_ttf_data <= pbVar18 + 3)) {
                      memcpy(__dest,pbVar18 + 3,uVar15 + 1);
                      uVar15 = (ulong)(ushort)(*(ushort *)(pbVar18 + 1) << 8 |
                                              *(ushort *)(pbVar18 + 1) >> 8);
                      puVar14 = puVar17;
                    }
                    lVar7 = 4;
                    stb__dout = puVar14;
                    goto LAB_001a2a9f;
                  }
                  break;
                }
                puVar14 = __dest + (ulong)pbVar18[4] + 1;
                if (__dest + (ulong)pbVar18[4] + 1 <= puVar1) {
                  bVar5 = pbVar18[1];
                  bVar9 = pbVar18[2];
                  bVar4 = pbVar18[3];
                  puVar14 = puVar16;
                  if (puVar6 <= __dest + ~((ulong)bVar5 * 0x10000 + (ulong)bVar4 |
                                          (ulong)bVar9 * 0x100)) {
                    uVar15 = (ulong)pbVar18[4] + 1;
                    do {
                      puVar14 = __dest + 1;
                      *__dest = __dest[~((ulong)bVar4 + (ulong)bVar9 * 0x100) +
                                       (ulong)bVar5 * -0x10000];
                      uVar11 = (int)uVar15 - 1;
                      uVar15 = (ulong)uVar11;
                      __dest = puVar14;
                    } while (uVar11 != 0);
                  }
                }
                pbVar19 = pbVar18 + 5;
                stb__dout = puVar14;
              }
            }
            else {
              bVar9 = pbVar18[1];
              uVar15 = (ulong)((uVar11 * 0x100 + (uint)bVar9) - 0x7ff);
              puVar14 = __dest + uVar15;
              puVar17 = puVar14;
              if ((puVar14 <= puVar1) && (puVar17 = puVar16, compressed_ttf_data <= pbVar18 + 2)) {
                memcpy(__dest,pbVar18 + 2,uVar15);
                bVar5 = *pbVar18;
                bVar9 = pbVar18[1];
                puVar17 = puVar14;
              }
              uVar15 = (ulong)CONCAT11(bVar5,bVar9);
              lVar7 = -0x7fd;
              stb__dout = puVar17;
LAB_001a2a9f:
              pbVar19 = pbVar18 + uVar15 + lVar7;
              puVar14 = stb__dout;
              if (pbVar19 == pbVar18) break;
            }
          }
          else {
            uVar10 = *(ushort *)(pbVar18 + 3) << 8 | *(ushort *)(pbVar18 + 3) >> 8;
            puVar14 = __dest + (ulong)uVar10 + 1;
            if ((__dest + (ulong)uVar10 + 1 <= puVar1) &&
               (uVar15 = (ulong)(((uint)pbVar18[1] * 0x100 +
                                 ((uint)pbVar18[2] | (uint)bVar5 << 0x10)) - 0xfffff),
               puVar14 = puVar16, puVar6 <= __dest + -uVar15)) {
              iVar12 = uVar10 + 1;
              do {
                puVar14 = __dest + 1;
                *__dest = __dest[-uVar15];
                iVar12 = iVar12 + -1;
                __dest = puVar14;
              } while (iVar12 != 0);
            }
            pbVar19 = pbVar18 + 5;
            stb__dout = puVar14;
          }
        }
        else {
          puVar14 = __dest + (ulong)pbVar18[3] + 1;
          if ((__dest + (ulong)pbVar18[3] + 1 <= puVar1) &&
             (uVar15 = (ulong)(((uint)pbVar18[1] * 0x100 + ((uint)pbVar18[2] | (uint)bVar5 << 0x10))
                              - 0x17ffff), puVar14 = puVar16, puVar6 <= __dest + -uVar15)) {
            uVar13 = (ulong)pbVar18[3] + 1;
            do {
              puVar14 = __dest + 1;
              *__dest = __dest[-uVar15];
              uVar11 = (int)uVar13 - 1;
              uVar13 = (ulong)uVar11;
              __dest = puVar14;
            } while (uVar11 != 0);
          }
          pbVar19 = pbVar18 + 4;
          stb__dout = puVar14;
        }
      }
      else if ((char)bVar5 < '\0') {
        uVar11 = uVar11 - 0x7f;
        uVar15 = (ulong)uVar11;
        puVar14 = __dest + uVar15;
        puVar17 = puVar14;
        if ((puVar14 <= puVar1) &&
           (bVar5 = pbVar18[1], puVar14 = puVar16, puVar17 = puVar16,
           puVar6 <= __dest + ~(ulong)bVar5)) {
          while (puVar14 = __dest, puVar17 = stb__dout, uVar11 != 0) {
            stb__dout = __dest + 1;
            *__dest = __dest[~(ulong)bVar5];
            uVar11 = (int)uVar15 - 1;
            uVar15 = (ulong)uVar11;
            __dest = stb__dout;
          }
        }
        stb__dout = puVar17;
        pbVar19 = pbVar18 + 2;
      }
      else {
        if (bVar5 < 0x40) {
          puVar14 = __dest + (uVar11 - 0x1f);
          puVar17 = puVar14;
          if ((puVar14 <= puVar1) && (puVar17 = puVar16, compressed_ttf_data <= pbVar18 + 1)) {
            memcpy(__dest,pbVar18 + 1,(ulong)(uVar11 - 0x1f));
            bVar5 = *pbVar18;
            puVar17 = puVar14;
          }
          uVar15 = (ulong)bVar5;
          lVar7 = -0x1e;
          stb__dout = puVar17;
          goto LAB_001a2a9f;
        }
        puVar14 = __dest + (ulong)pbVar18[2] + 1;
        if ((__dest + (ulong)pbVar18[2] + 1 <= puVar1) &&
           (uVar15 = (ulong)(((uint)bVar5 * 0x100 + (uint)pbVar18[1]) - 0x3fff), puVar14 = puVar16,
           puVar6 <= __dest + -uVar15)) {
          uVar13 = (ulong)pbVar18[2] + 1;
          do {
            puVar14 = __dest + 1;
            *__dest = __dest[-uVar15];
            uVar11 = (int)uVar13 - 1;
            uVar13 = (ulong)uVar11;
            __dest = puVar14;
          } while (uVar11 != 0);
        }
        pbVar19 = pbVar18 + 3;
        stb__dout = puVar14;
      }
      __dest = puVar14;
      pbVar18 = pbVar19;
    } while (puVar14 <= puVar1);
  }
  if (font_cfg_template == (ImFontConfig *)0x0) {
    local_d8.MergeMode = false;
    local_d8._73_3_ = 0;
    local_d8.FontBuilderFlags = 0;
    local_170._0_3_ = 0;
    local_170._3_4_ = 0;
    uStack_169 = 0;
    local_148._0_1_ = false;
    local_148._1_3_ = 0;
    local_148._4_4_ = 0.0;
    uStack_140._0_4_ = 0.0;
    uStack_140._4_4_ = 0.0;
    local_138._0_4_ = 0.0;
    local_138._4_4_ = 0;
    pIStack_130 = (ImWchar *)0x0;
    local_128 = 0.0;
    local_118[0] = '\0';
    local_118[1] = '\0';
    local_118[2] = '\0';
    local_118[3] = '\0';
    local_118[4] = '\0';
    local_118[5] = '\0';
    local_118[6] = '\0';
    local_118[7] = '\0';
    local_118[8] = '\0';
    local_118[9] = '\0';
    local_118[10] = '\0';
    local_118[0xb] = '\0';
    local_118[0xc] = '\0';
    local_118[0xd] = '\0';
    local_118[0xe] = '\0';
    local_118[0xf] = '\0';
    local_118[0x10] = '\0';
    local_118[0x11] = '\0';
    local_118[0x12] = '\0';
    local_118[0x13] = '\0';
    local_118[0x14] = '\0';
    local_118[0x15] = '\0';
    local_118[0x16] = '\0';
    local_118[0x17] = '\0';
    local_118[0x18] = '\0';
    local_118[0x19] = '\0';
    local_118[0x1a] = '\0';
    local_118[0x1b] = '\0';
    local_118[0x1c] = '\0';
    local_118[0x1d] = '\0';
    local_118[0x1e] = '\0';
    local_118[0x1f] = '\0';
    local_118[0x20] = '\0';
    local_118[0x21] = '\0';
    local_118[0x22] = '\0';
    local_118[0x23] = '\0';
    local_118[0x24] = '\0';
    local_118[0x25] = '\0';
    local_118[0x26] = '\0';
    local_118[0x27] = '\0';
    local_118[0x28] = 0;
    local_118[0x29] = 0;
    local_118[0x2a] = 0;
    local_118[0x2b] = 0;
    local_118[0x2c] = 0;
    local_118[0x2d] = 0;
    uStack_ea = 0;
    uStack_e8 = 0;
    local_d8.OversampleH = 2;
    local_d8.OversampleV = 1;
    fVar2 = 1.0;
    fVar3 = 1.0;
    local_d8.EllipsisChar = 0xffff;
    local_d8.GlyphMaxAdvanceX = 3.4028235e+38;
  }
  else {
    local_170 = (undefined7)*(undefined8 *)&font_cfg_template->field_0xd;
    uStack_169._1_3_ = (undefined3)((uint)font_cfg_template->SizePixels >> 8);
    uStack_169._0_1_ = (undefined1)((ulong)*(undefined8 *)&font_cfg_template->field_0xd >> 0x38);
    local_d8.OversampleH = font_cfg_template->OversampleH;
    local_d8.OversampleV = font_cfg_template->OversampleV;
    local_148._0_1_ = font_cfg_template->PixelSnapH;
    local_148._1_3_ = *(undefined3 *)&font_cfg_template->field_0x21;
    local_148._4_4_ = (font_cfg_template->GlyphExtraSpacing).x;
    uStack_140 = *(undefined8 *)&(font_cfg_template->GlyphExtraSpacing).y;
    local_138 = *(undefined8 *)&(font_cfg_template->GlyphOffset).y;
    pIStack_130 = font_cfg_template->GlyphRanges;
    local_128 = font_cfg_template->GlyphMinAdvanceX;
    local_d8.GlyphMaxAdvanceX = font_cfg_template->GlyphMaxAdvanceX;
    local_d8.MergeMode = font_cfg_template->MergeMode;
    local_d8._73_3_ = *(undefined3 *)&font_cfg_template->field_0x49;
    local_d8.FontBuilderFlags = font_cfg_template->FontBuilderFlags;
    fVar2 = font_cfg_template->RasterizerMultiply;
    fVar3 = font_cfg_template->RasterizerDensity;
    local_d8.EllipsisChar = font_cfg_template->EllipsisChar;
    uStack_e8 = (undefined6)((ulong)font_cfg_template->DstFont >> 0x10);
    local_118._32_8_ = *(undefined8 *)(font_cfg_template->Name + 0x20);
    local_118._40_6_ = (undefined6)*(undefined8 *)&font_cfg_template->field_0x82;
    uStack_ea = (undefined2)((ulong)*(undefined8 *)&font_cfg_template->field_0x82 >> 0x30);
    local_118._16_8_ = *(undefined8 *)(font_cfg_template->Name + 0x10);
    local_118._24_8_ = *(undefined8 *)(font_cfg_template->Name + 0x18);
    local_118._0_8_ = *(undefined8 *)font_cfg_template->Name;
    local_118._8_8_ = *(undefined8 *)(font_cfg_template->Name + 8);
  }
  local_d8.FontDataOwnedByAtlas = true;
  local_d8._13_3_ = (undefined3)local_170;
  local_d8.FontNo = local_170._3_4_;
  local_d8.PixelSnapH = local_148._0_1_;
  local_d8._33_3_ = local_148._1_3_;
  local_d8.GlyphExtraSpacing.x = local_148._4_4_;
  local_d8.GlyphExtraSpacing.y = (float)uStack_140;
  local_d8.GlyphOffset.x = uStack_140._4_4_;
  local_d8.GlyphOffset.y = (float)local_138;
  local_d8._52_4_ = local_138._4_4_;
  local_d8.GlyphRanges = pIStack_130;
  local_d8.GlyphMinAdvanceX = local_128;
  local_d8.RasterizerDensity = fVar3;
  local_d8.RasterizerMultiply = fVar2;
  local_d8.Name[0] = local_118[0];
  local_d8.Name[1] = local_118[1];
  local_d8.Name[2] = local_118[2];
  local_d8.Name[3] = local_118[3];
  local_d8.Name[4] = local_118[4];
  local_d8.Name[5] = local_118[5];
  local_d8.Name[6] = local_118[6];
  local_d8.Name[7] = local_118[7];
  local_d8.Name[8] = local_118[8];
  local_d8.Name[9] = local_118[9];
  local_d8.Name[10] = local_118[10];
  local_d8.Name[0xb] = local_118[0xb];
  local_d8.Name[0xc] = local_118[0xc];
  local_d8.Name[0xd] = local_118[0xd];
  local_d8.Name[0xe] = local_118[0xe];
  local_d8.Name[0xf] = local_118[0xf];
  local_d8.Name[0x10] = local_118[0x10];
  local_d8.Name[0x11] = local_118[0x11];
  local_d8.Name[0x12] = local_118[0x12];
  local_d8.Name[0x13] = local_118[0x13];
  local_d8.Name[0x14] = local_118[0x14];
  local_d8.Name[0x15] = local_118[0x15];
  local_d8.Name[0x16] = local_118[0x16];
  local_d8.Name[0x17] = local_118[0x17];
  local_d8.Name[0x18] = local_118[0x18];
  local_d8.Name[0x19] = local_118[0x19];
  local_d8.Name[0x1a] = local_118[0x1a];
  local_d8.Name[0x1b] = local_118[0x1b];
  local_d8.Name[0x1c] = local_118[0x1c];
  local_d8.Name[0x1d] = local_118[0x1d];
  local_d8.Name[0x1e] = local_118[0x1e];
  local_d8.Name[0x1f] = local_118[0x1f];
  local_d8.Name[0x20] = local_118[0x20];
  local_d8.Name[0x21] = local_118[0x21];
  local_d8.Name[0x22] = local_118[0x22];
  local_d8.Name[0x23] = local_118[0x23];
  local_d8.Name[0x24] = local_118[0x24];
  local_d8.Name[0x25] = local_118[0x25];
  local_d8.Name[0x26] = local_118[0x26];
  local_d8.Name[0x27] = local_118[0x27];
  local_d8._130_1_ = local_118[0x28];
  local_d8._131_1_ = local_118[0x29];
  local_d8._132_1_ = local_118[0x2a];
  local_d8._133_1_ = local_118[0x2b];
  local_d8._134_1_ = local_118[0x2c];
  local_d8._135_1_ = local_118[0x2d];
  local_d8.DstFont._0_2_ = uStack_ea;
  local_d8.DstFont._2_6_ = uStack_e8;
  local_d8.SizePixels =
       (float)(~-(uint)(0.0 < local_48) & uStack_169 | (uint)local_48 & -(uint)(0.0 < local_48));
  if (glyph_ranges != (ImWchar *)0x0) {
    local_d8.GlyphRanges = glyph_ranges;
  }
  local_d8.FontData = puVar6;
  local_d8.FontDataSize = uVar20;
  pIVar8 = AddFont(this,&local_d8);
  return pIVar8;
}

Assistant:

ImFont* ImFontAtlas::AddFontFromMemoryCompressedTTF(const void* compressed_ttf_data, int compressed_ttf_size, float size_pixels, const ImFontConfig* font_cfg_template, const ImWchar* glyph_ranges)
{
    const unsigned int buf_decompressed_size = stb_decompress_length((const unsigned char*)compressed_ttf_data);
    unsigned char* buf_decompressed_data = (unsigned char*)IM_ALLOC(buf_decompressed_size);
    stb_decompress(buf_decompressed_data, (const unsigned char*)compressed_ttf_data, (unsigned int)compressed_ttf_size);

    ImFontConfig font_cfg = font_cfg_template ? *font_cfg_template : ImFontConfig();
    IM_ASSERT(font_cfg.FontData == NULL);
    font_cfg.FontDataOwnedByAtlas = true;
    return AddFontFromMemoryTTF(buf_decompressed_data, (int)buf_decompressed_size, size_pixels, &font_cfg, glyph_ranges);
}